

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  byte bVar1;
  uint uVar2;
  TValue *pTVar3;
  TRef *pTVar4;
  TRef TVar5;
  
  pTVar3 = J->L->base;
  bVar1 = *(byte *)((ulong)*(uint *)((ulong)pTVar3[-1].u32.lo + 0x10) - 0x39);
  pTVar3[bVar1].u64 = (uint64_t)(cont + -0x14f5b0);
  TVar5 = lj_ir_kptr_(J,IR_KPTR,cont + -0x14f5b0);
  pTVar4 = J->base;
  pTVar4[bVar1] = TVar5 | 0x20000;
  J->framedepth = J->framedepth + 1;
  uVar2 = J->maxslot;
  if (uVar2 < bVar1) {
    memset(pTVar4 + uVar2,0,(ulong)(~uVar2 + (uint)bVar1) * 4 + 4);
  }
  return bVar1 + 1;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = curr_proto(J->L)->framesize;
  TRef trcont;
  setcont(&J->L->base[top], cont);
#if LJ_64
  trcont = lj_ir_kptr(J, (void *)((int64_t)cont - (int64_t)lj_vm_asm_begin));
#else
  trcont = lj_ir_kptr(J, (void *)cont);
#endif
  J->base[top] = trcont | TREF_CONT;
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1;
}